

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_queue.h
# Opt level: O2

iterator * __thiscall
bidfx_public_api::tools::BlockingQueue<int>::Poll
          (iterator *__return_storage_ptr__,BlockingQueue<int> *this,milliseconds duration)

{
  long lVar1;
  long lVar2;
  long lVar3;
  unique_lock<std::mutex> lock;
  duration<long,_std::ratio<1L,_1000000000L>_> local_48;
  unique_lock<std::mutex> local_40;
  
  lVar1 = std::chrono::_V2::steady_clock::now();
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->mutex_);
  lVar2 = std::chrono::_V2::steady_clock::now();
  while (((this->queue_).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
          ._M_finish._M_cur ==
          (this->queue_).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
          ._M_start._M_cur &&
         (lVar3 = duration.__r * 1000000 - (lVar2 - lVar1),
         lVar3 != 0 && lVar2 - lVar1 <= duration.__r * 1000000))) {
    local_48.__r = lVar3;
    std::condition_variable::wait_for<long,std::ratio<1l,1000000000l>>
              (&this->condition_,&local_40,&local_48);
    lVar2 = std::chrono::_V2::steady_clock::now();
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  Pop(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

typename std::deque<T>::iterator Poll(std::chrono::milliseconds duration)
    {
        {
            std::chrono::steady_clock::time_point start = std::chrono::steady_clock::now();
            std::unique_lock<std::mutex> lock(mutex_);
            std::chrono::nanoseconds elapsed = std::chrono::steady_clock::now() - start;
            while (queue_.empty() && elapsed < duration)
            {
                condition_.wait_for(lock, duration - elapsed);
                elapsed = std::chrono::steady_clock::now() - start;
            }
        }
        return Pop();
    }